

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationInvarianceTests.cpp
# Opt level: O0

bool vkt::tessellation::anon_unknown_0::PrimitiveSetInvariance::
     compareTriangleSets<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::InvariantOuterTriangleSetTestInstance::IsQuadTriangleOnOuterEdge>
               (PerPrimitiveVec *primitivesA,PerPrimitiveVec *primitivesB,TestLog *log,
               IsQuadTriangleOnOuterEdge *isTriangleRelevant,char *ignoredTriangleDescription)

{
  vector<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
  *this;
  int iVar1;
  bool bVar2;
  size_type sVar3;
  size_type sVar4;
  const_reference primitive;
  Vector<float,_3> *pVVar5;
  Vector<float,_3> *pVVar6;
  reference pVVar7;
  reference pVVar8;
  MessageBuilder *pMVar9;
  bool local_6c2;
  bool local_6c1;
  bool local_68a;
  size_t *local_658;
  MessageBuilder local_638;
  MessageBuilder local_4b8;
  LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>
  local_333;
  byte local_332;
  byte local_331;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  byte local_2ea;
  allocator<char> local_2e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  MessageBuilder local_2c8;
  _Self local_148;
  byte local_139;
  iterator iStack_138;
  bool bEnd;
  byte local_129;
  iterator iStack_128;
  bool aEnd;
  _Self local_120;
  _Self local_118;
  const_iterator bIt;
  const_iterator aIt;
  VecLexLessThan<3> local_f1;
  undefined1 local_f0 [8];
  Triangle triangle;
  int triNdx;
  TriangleSet *triangles;
  int numTriangles;
  PerPrimitiveVec *primitives;
  int aOrB;
  undefined1 local_a0 [8];
  TriangleSet trianglesB;
  TriangleSet trianglesA;
  int numTrianglesB;
  int numTrianglesA;
  char *ignoredTriangleDescription_local;
  IsQuadTriangleOnOuterEdge *isTriangleRelevant_local;
  TestLog *log_local;
  PerPrimitiveVec *primitivesB_local;
  PerPrimitiveVec *primitivesA_local;
  
  sVar3 = std::
          vector<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
          ::size(primitivesA);
  sVar4 = std::
          vector<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
          ::size(primitivesB);
  std::
  set<tcu::Vector<tcu::Vector<float,_3>,_3>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
  ::set((set<tcu::Vector<tcu::Vector<float,_3>,_3>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
         *)&trianglesB._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  set<tcu::Vector<tcu::Vector<float,_3>,_3>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
  ::set((set<tcu::Vector<tcu::Vector<float,_3>,_3>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
         *)local_a0);
  for (primitives._0_4_ = 0; (int)primitives < 2; primitives._0_4_ = (int)primitives + 1) {
    if ((int)primitives == 0) {
      local_658 = &trianglesB._M_t._M_impl.super__Rb_tree_header._M_node_count;
      this = primitivesA;
      iVar1 = (int)sVar3;
    }
    else {
      local_658 = (size_t *)local_a0;
      this = primitivesB;
      iVar1 = (int)sVar4;
    }
    stack0xffffffffffffff38 = local_658;
    for (triangle.m_data[2].m_data[1] = 0.0; (int)triangle.m_data[2].m_data[1] < iVar1;
        triangle.m_data[2].m_data[1] = (float)((int)triangle.m_data[2].m_data[1] + 1)) {
      primitive = std::
                  vector<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                  ::operator[](this,(long)(int)triangle.m_data[2].m_data[1]);
      makeTriangle((Triangle *)local_f0,primitive);
      pVVar5 = tcu::Vector<tcu::Vector<float,_3>,_3>::getPtr
                         ((Vector<tcu::Vector<float,_3>,_3> *)local_f0);
      bVar2 = InvariantOuterTriangleSetTestInstance::IsQuadTriangleOnOuterEdge::operator()
                        (isTriangleRelevant,pVVar5);
      if (bVar2) {
        pVVar5 = tcu::Vector<tcu::Vector<float,_3>,_3>::getPtr
                           ((Vector<tcu::Vector<float,_3>,_3> *)local_f0);
        pVVar6 = tcu::Vector<tcu::Vector<float,_3>,_3>::getPtr
                           ((Vector<tcu::Vector<float,_3>,_3> *)local_f0);
        local_f1 = (VecLexLessThan<3>)0x0;
        VecLexLessThan<3>::VecLexLessThan(&local_f1);
        std::sort<tcu::Vector<float,3>*,vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>>
                  (pVVar5,pVVar6 + 3);
        std::
        set<tcu::Vector<tcu::Vector<float,_3>,_3>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
        ::insert((set<tcu::Vector<tcu::Vector<float,_3>,_3>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
                  *)stack0xffffffffffffff38,(value_type *)local_f0);
      }
    }
  }
  bIt._M_node = (_Base_ptr)
                std::
                set<tcu::Vector<tcu::Vector<float,_3>,_3>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
                ::begin((set<tcu::Vector<tcu::Vector<float,_3>,_3>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
                         *)&trianglesB._M_t._M_impl.super__Rb_tree_header._M_node_count);
  local_118._M_node =
       (_Base_ptr)
       std::
       set<tcu::Vector<tcu::Vector<float,_3>,_3>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
       ::begin((set<tcu::Vector<tcu::Vector<float,_3>,_3>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
                *)local_a0);
  while( true ) {
    local_120._M_node =
         (_Base_ptr)
         std::
         set<tcu::Vector<tcu::Vector<float,_3>,_3>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
         ::end((set<tcu::Vector<tcu::Vector<float,_3>,_3>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
                *)&trianglesB._M_t._M_impl.super__Rb_tree_header._M_node_count);
    bVar2 = std::operator!=(&bIt,&local_120);
    local_68a = true;
    if (!bVar2) {
      iStack_128 = std::
                   set<tcu::Vector<tcu::Vector<float,_3>,_3>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
                   ::end((set<tcu::Vector<tcu::Vector<float,_3>,_3>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
                          *)local_a0);
      local_68a = std::operator!=(&local_118,&stack0xfffffffffffffed8);
    }
    if (local_68a == false) {
      primitivesA_local._7_1_ = true;
      goto LAB_00dde073;
    }
    iStack_138 = std::
                 set<tcu::Vector<tcu::Vector<float,_3>,_3>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
                 ::end((set<tcu::Vector<tcu::Vector<float,_3>,_3>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
                        *)&trianglesB._M_t._M_impl.super__Rb_tree_header._M_node_count);
    local_129 = std::operator==(&bIt,&stack0xfffffffffffffec8);
    local_148._M_node =
         (_Base_ptr)
         std::
         set<tcu::Vector<tcu::Vector<float,_3>,_3>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
         ::end((set<tcu::Vector<tcu::Vector<float,_3>,_3>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
                *)local_a0);
    local_139 = std::operator==(&local_118,&local_148);
    if (((local_129 & 1) != 0) || ((bool)local_139)) break;
    pVVar7 = std::_Rb_tree_const_iterator<tcu::Vector<tcu::Vector<float,_3>,_3>_>::operator*(&bIt);
    pVVar8 = std::_Rb_tree_const_iterator<tcu::Vector<tcu::Vector<float,_3>,_3>_>::operator*
                       (&local_118);
    bVar2 = tcu::Vector<tcu::Vector<float,_3>,_3>::operator!=(pVVar7,pVVar8);
    if (bVar2) break;
    std::_Rb_tree_const_iterator<tcu::Vector<tcu::Vector<float,_3>,_3>_>::operator++(&bIt);
    std::_Rb_tree_const_iterator<tcu::Vector<tcu::Vector<float,_3>,_3>_>::operator++(&local_118);
  }
  tcu::TestLog::operator<<(&local_2c8,log,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar9 = tcu::MessageBuilder::operator<<
                     (&local_2c8,
                      (char (*) [91])
                      "Failure: triangle sets in two cases are not equal (when ignoring triangle and vertex order"
                     );
  local_2ea = 0;
  local_331 = 0;
  local_332 = 0;
  if (ignoredTriangleDescription == (char *)0x0) {
    std::allocator<char>::allocator();
    local_2ea = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e8,"",&local_2e9);
  }
  else {
    std::__cxx11::string::string((string *)&local_330);
    local_331 = 1;
    std::operator+(&local_310,&local_330,", and ");
    local_332 = 1;
    std::operator+(&local_2e8,&local_310,ignoredTriangleDescription);
  }
  pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_2e8);
  pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [2])0x12d99d9);
  tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::string::~string((string *)&local_2e8);
  if ((local_332 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_310);
  }
  if ((local_331 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_330);
  }
  if ((local_2ea & 1) != 0) {
    std::allocator<char>::~allocator(&local_2e9);
  }
  tcu::MessageBuilder::~MessageBuilder(&local_2c8);
  local_6c1 = false;
  if ((local_129 & 1) == 0) {
    local_6c2 = true;
    if ((local_139 & 1) == 0) {
      LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>
      ::LexCompare(&local_333);
      pVVar7 = std::_Rb_tree_const_iterator<tcu::Vector<tcu::Vector<float,_3>,_3>_>::operator*(&bIt)
      ;
      pVVar8 = std::_Rb_tree_const_iterator<tcu::Vector<tcu::Vector<float,_3>,_3>_>::operator*
                         (&local_118);
      local_6c2 = LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>
                  ::operator()(&local_333,pVVar7,pVVar8);
    }
    local_6c1 = local_6c2;
  }
  if (local_6c1 == false) {
    tcu::TestLog::operator<<(&local_638,log,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar9 = tcu::MessageBuilder::operator<<(&local_638,(char (*) [21])"Note: e.g. triangle ");
    pVVar7 = std::_Rb_tree_const_iterator<tcu::Vector<tcu::Vector<float,_3>,_3>_>::operator*
                       (&local_118);
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,pVVar7);
    pMVar9 = tcu::MessageBuilder::operator<<
                       (pMVar9,(char (*) [42])" exists for second case but not for first");
    tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_638);
  }
  else {
    tcu::TestLog::operator<<(&local_4b8,log,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar9 = tcu::MessageBuilder::operator<<(&local_4b8,(char (*) [21])"Note: e.g. triangle ");
    pVVar7 = std::_Rb_tree_const_iterator<tcu::Vector<tcu::Vector<float,_3>,_3>_>::operator*(&bIt);
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,pVVar7);
    pMVar9 = tcu::MessageBuilder::operator<<
                       (pMVar9,(char (*) [42])" exists for first case but not for second");
    tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_4b8);
  }
  primitivesA_local._7_1_ = false;
LAB_00dde073:
  std::
  set<tcu::Vector<tcu::Vector<float,_3>,_3>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
  ::~set((set<tcu::Vector<tcu::Vector<float,_3>,_3>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
          *)local_a0);
  std::
  set<tcu::Vector<tcu::Vector<float,_3>,_3>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
  ::~set((set<tcu::Vector<tcu::Vector<float,_3>,_3>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
          *)&trianglesB._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return primitivesA_local._7_1_;
}

Assistant:

bool compareTriangleSets (const PerPrimitiveVec&		primitivesA,
						  const PerPrimitiveVec&		primitivesB,
						  tcu::TestLog&					log,
						  const IsTriangleRelevantT&	isTriangleRelevant,
						  const char*					ignoredTriangleDescription = DE_NULL)
{
	typedef LexCompare<Triangle, 3, VecLexLessThan<3> >		TriangleLexLessThan;
	typedef std::set<Triangle, TriangleLexLessThan>			TriangleSet;

	const int		numTrianglesA = static_cast<int>(primitivesA.size());
	const int		numTrianglesB = static_cast<int>(primitivesB.size());
	TriangleSet		trianglesA;
	TriangleSet		trianglesB;

	for (int aOrB = 0; aOrB < 2; ++aOrB)
	{
		const PerPrimitiveVec& primitives	= aOrB == 0 ? primitivesA	: primitivesB;
		const int			   numTriangles	= aOrB == 0 ? numTrianglesA	: numTrianglesB;
		TriangleSet&		   triangles	= aOrB == 0 ? trianglesA	: trianglesB;

		for (int triNdx = 0; triNdx < numTriangles; ++triNdx)
		{
			Triangle triangle = makeTriangle(primitives[triNdx]);

			if (isTriangleRelevant(triangle.getPtr()))
			{
				std::sort(triangle.getPtr(), triangle.getPtr()+3, VecLexLessThan<3>());
				triangles.insert(triangle);
			}
		}
	}
	{
		TriangleSet::const_iterator aIt = trianglesA.begin();
		TriangleSet::const_iterator bIt = trianglesB.begin();

		while (aIt != trianglesA.end() || bIt != trianglesB.end())
		{
			const bool aEnd = aIt == trianglesA.end();
			const bool bEnd = bIt == trianglesB.end();

			if (aEnd || bEnd || *aIt != *bIt)
			{
				log << tcu::TestLog::Message << "Failure: triangle sets in two cases are not equal (when ignoring triangle and vertex order"
					<< (ignoredTriangleDescription == DE_NULL ? "" : std::string() + ", and " + ignoredTriangleDescription) << ")" << tcu::TestLog::EndMessage;

				if (!aEnd && (bEnd || TriangleLexLessThan()(*aIt, *bIt)))
					log << tcu::TestLog::Message << "Note: e.g. triangle " << *aIt << " exists for first case but not for second" << tcu::TestLog::EndMessage;
				else
					log << tcu::TestLog::Message << "Note: e.g. triangle " << *bIt << " exists for second case but not for first" << tcu::TestLog::EndMessage;

				return false;
			}

			++aIt;
			++bIt;
		}

		return true;
	}
}